

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutOracle.c
# Opt level: O2

Cut_Oracle_t * Cut_OracleStart(Cut_Man_t *pMan)

{
  uint uVar1;
  int iVar2;
  Cut_Params_t *pCVar3;
  Vec_Int_t *pVVar4;
  Vec_Int_t *pVVar5;
  Cut_Oracle_t *pCVar6;
  Vec_Ptr_t *pVVar7;
  ulong uVar8;
  Extra_MmFixed_t *pEVar9;
  ulong uVar10;
  int iVar11;
  char *__assertion;
  
  pCVar3 = pMan->pParams;
  if (pCVar3->nVarsMax - 3U < 10) {
    if (pCVar3->fRecord != 0) {
      pCVar6 = (Cut_Oracle_t *)calloc(1,0x68);
      pCVar6->pParams = pCVar3;
      pVVar4 = pMan->vNodeCuts;
      pVVar5 = pMan->vNodeStarts;
      pMan->vNodeCuts = (Vec_Int_t *)0x0;
      pCVar6->vNodeCuts = pVVar4;
      pCVar6->vNodeStarts = pVVar5;
      pMan->vNodeStarts = (Vec_Int_t *)0x0;
      pCVar6->vCutPairs = pMan->vCutPairs;
      pMan->vCutPairs = (Vec_Int_t *)0x0;
      pVVar7 = Vec_PtrAlloc(pCVar3->nIdsMax);
      pCVar6->vCutsNew = pVVar7;
      uVar1 = pCVar3->nIdsMax;
      Vec_PtrGrow(pVVar7,uVar1);
      uVar8 = 0;
      uVar10 = 0;
      if (0 < (int)uVar1) {
        uVar10 = (ulong)uVar1;
      }
      for (; uVar10 != uVar8; uVar8 = uVar8 + 1) {
        pVVar7->pArray[uVar8] = (void *)0x0;
      }
      pVVar7->nSize = uVar1;
      pVVar7 = Vec_PtrAlloc(100);
      pCVar6->vCuts0 = pVVar7;
      pVVar7 = Vec_PtrAlloc(100);
      pCVar6->vCuts1 = pVVar7;
      iVar2 = pCVar3->nVarsMax;
      iVar11 = iVar2 * 4 + 0x18;
      pCVar6->EntrySize = iVar11;
      if (pCVar3->fTruth != 0) {
        if (iVar2 < 9) {
          iVar11 = 1 << ((char)iVar2 - 5U & 0x1f);
          if (iVar2 < 6) {
            iVar11 = 1;
          }
          pCVar6->nTruthWords = iVar11;
          iVar11 = (iVar11 + iVar2) * 4 + 0x18;
          pCVar6->EntrySize = iVar11;
        }
        else {
          pCVar3->fTruth = 0;
          puts("Skipping computation of truth table for more than 8 inputs.");
        }
      }
      pEVar9 = Extra_MmFixedStart(iVar11);
      pCVar6->pMmCuts = pEVar9;
      return pCVar6;
    }
    __assertion = "pMan->pParams->fRecord";
    uVar1 = 0x4e;
  }
  else {
    __assertion = "pMan->pParams->nVarsMax >= 3 && pMan->pParams->nVarsMax <= CUT_SIZE_MAX";
    uVar1 = 0x4d;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/cut/cutOracle.c"
                ,uVar1,"Cut_Oracle_t *Cut_OracleStart(Cut_Man_t *)");
}

Assistant:

Cut_Oracle_t * Cut_OracleStart( Cut_Man_t * pMan )
{
    Cut_Oracle_t * p;

    assert( pMan->pParams->nVarsMax >= 3 && pMan->pParams->nVarsMax <= CUT_SIZE_MAX );
    assert( pMan->pParams->fRecord );

    p = ABC_ALLOC( Cut_Oracle_t, 1 );
    memset( p, 0, sizeof(Cut_Oracle_t) );

    // set and correct parameters
    p->pParams     = pMan->pParams;

    // transfer the recording info
    p->vNodeCuts   = pMan->vNodeCuts;    pMan->vNodeCuts   = NULL;
    p->vNodeStarts = pMan->vNodeStarts;  pMan->vNodeStarts = NULL;
    p->vCutPairs   = pMan->vCutPairs;    pMan->vCutPairs   = NULL;

    // prepare storage for cuts
    p->vCutsNew = Vec_PtrAlloc( p->pParams->nIdsMax );
    Vec_PtrFill( p->vCutsNew, p->pParams->nIdsMax, NULL );
    p->vCuts0 = Vec_PtrAlloc( 100 );
    p->vCuts1 = Vec_PtrAlloc( 100 );

    // entry size
    p->EntrySize = sizeof(Cut_Cut_t) + p->pParams->nVarsMax * sizeof(int);
    if ( p->pParams->fTruth )
    {
        if ( p->pParams->nVarsMax > 8 )
        {
            p->pParams->fTruth = 0;
            printf( "Skipping computation of truth table for more than 8 inputs.\n" );
        }
        else
        {
            p->nTruthWords = Cut_TruthWords( p->pParams->nVarsMax );
            p->EntrySize += p->nTruthWords * sizeof(unsigned);
        }
    }
    // memory for cuts
    p->pMmCuts = Extra_MmFixedStart( p->EntrySize );
    return p;
}